

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWJoint.h
# Opt level: O0

void __thiscall COLLADAFW::Joint::~Joint(Joint *this)

{
  PointerArray<COLLADAFW::JointPrimitive> *in_RDI;
  
  in_RDI->_vptr_PointerArray = (_func_int **)&PTR__Joint_00db8340;
  PointerArray<COLLADAFW::JointPrimitive>::~PointerArray(in_RDI);
  std::__cxx11::string::~string
            ((string *)&in_RDI[1].super_ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>.mCapacity);
  std::__cxx11::string::~string
            ((string *)&(in_RDI->super_ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>).mFlags);
  ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>::~ObjectTemplate
            ((ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004> *)in_RDI);
  return;
}

Assistant:

virtual ~Joint(){}